

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

Kit_Node_t * Kit_GraphAppendNode(Kit_Graph_t *pGraph)

{
  int iVar1;
  size_t __size;
  Kit_Node_t *pKVar2;
  
  if (pGraph->nSize == pGraph->nCap) {
    __size = (long)pGraph->nCap * 0x30;
    if (pGraph->pNodes == (Kit_Node_t *)0x0) {
      pKVar2 = (Kit_Node_t *)malloc(__size);
    }
    else {
      pKVar2 = (Kit_Node_t *)realloc(pGraph->pNodes,__size);
    }
    pGraph->pNodes = pKVar2;
    pGraph->nCap = pGraph->nCap << 1;
  }
  iVar1 = pGraph->nSize;
  pGraph->nSize = iVar1 + 1;
  pKVar2 = pGraph->pNodes + iVar1;
  pKVar2->eEdge0 = (Kit_Edge_t)0x0;
  pKVar2->eEdge1 = (Kit_Edge_t)0x0;
  (pKVar2->field_2).pFunc = (void *)0x0;
  *(undefined8 *)&pKVar2->field_0x10 = 0;
  return pKVar2;
}

Assistant:

Kit_Node_t * Kit_GraphAppendNode( Kit_Graph_t * pGraph )   
{
    Kit_Node_t * pNode;
    if ( pGraph->nSize == pGraph->nCap )
    {
        pGraph->pNodes = ABC_REALLOC( Kit_Node_t, pGraph->pNodes, 2 * pGraph->nCap ); 
        pGraph->nCap   = 2 * pGraph->nCap;
    }
    pNode = pGraph->pNodes + pGraph->nSize++;
    memset( pNode, 0, sizeof(Kit_Node_t) );
    return pNode;
}